

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

Bool prvTidyIsAnchorElement(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  
  TVar1 = TidyTag_UNKNOWN;
  if ((node != (Node *)0x0) && (TVar1 = TidyTag_UNKNOWN, node->tag != (Dict *)0x0)) {
    TVar1 = node->tag->id;
  }
  if ((TVar1 - TidyTag_A < 0x40) &&
     ((0x800a003000000021U >> ((ulong)(TVar1 - TidyTag_A) & 0x3f) & 1) != 0)) {
    return yes;
  }
  return no;
}

Assistant:

Bool TY_(IsAnchorElement)( TidyDocImpl* ARG_UNUSED(doc), Node* node)
{
    TidyTagId tid = TagId( node );
    if ( tid == TidyTag_A      ||
         tid == TidyTag_APPLET ||
         tid == TidyTag_FORM   ||
         tid == TidyTag_FRAME  ||
         tid == TidyTag_IFRAME ||
         tid == TidyTag_IMG    ||
         tid == TidyTag_MAP )
        return yes;

    return no;
}